

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

uint __thiscall Js::FunctionProxy::GetCompileCount(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  
  pFVar4 = (this->functionInfo).ptr;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x584,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_006da5bd;
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
  }
  if ((pFVar4->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x585,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_006da5bd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
  }
  return pFVar4->compileCount;
}

Assistant:

inline uint FunctionProxy::GetCompileCount() const
    {
        Assert(GetFunctionInfo());
        Assert(GetFunctionInfo()->GetFunctionProxy() == this);
        return GetFunctionInfo()->GetCompileCount();
    }